

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxseparate.cpp
# Opt level: O1

void print_help(void)

{
  puts(
      "voxseparate v1.0 by Justin Paver - source code available here: http://github.com/jpaver/opengametools \n\nThis tool extracts models out of MagicaVoxel .vox files and saves them as individual models within separate .vox files.\n\n usage: voxseparate <input_file.vox> <input_file2.vox> ...\n\n  It is recommended that you provide names for each instance of your model within the .vox files so\n  that output filenames make sense, otherwise output filenames will be auto-generated"
      );
  return;
}

Assistant:

void print_help() {
    printf(
        "voxseparate v1.0 by Justin Paver - source code available here: http://github.com/jpaver/opengametools \n"
        "\n"
        "This tool extracts models out of MagicaVoxel .vox files and saves them as individual models within separate .vox files.\n"
        "\n"
        " usage: voxseparate <input_file.vox> <input_file2.vox> ...\n"
        "\n"
        "  It is recommended that you provide names for each instance of your model within the .vox files so\n"
        "  that output filenames make sense, otherwise output filenames will be auto-generated\n"
    );
}